

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void move_tokens(VARR_token_t *to,VARR_token_t *from)

{
  size_t sVar1;
  token_t obj;
  size_t i;
  ulong ix;
  
  ix = 0;
  VARR_token_ttrunc(to,0);
  while( true ) {
    sVar1 = VARR_token_tlength(from);
    if (sVar1 <= ix) break;
    obj = VARR_token_tget(from,ix);
    VARR_token_tpush(to,obj);
    ix = ix + 1;
  }
  VARR_token_ttrunc(from,0);
  return;
}

Assistant:

static void move_tokens (VARR (token_t) * to, VARR (token_t) * from) {
  VARR_TRUNC (token_t, to, 0);
  for (size_t i = 0; i < VARR_LENGTH (token_t, from); i++)
    VARR_PUSH (token_t, to, VARR_GET (token_t, from, i));
  VARR_TRUNC (token_t, from, 0);
}